

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitArraySet(OptimizeInstructions *this,ArraySet *curr)

{
  bool bVar1;
  uint bytes;
  Expression **value;
  Field *this_00;
  undefined1 local_30 [8];
  optional<wasm::Field> field;
  ArraySet *curr_local;
  OptimizeInstructions *this_local;
  
  field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Field>._16_8_ = curr;
  skipNonNullCast(this,&curr->ref,(Expression *)curr);
  bVar1 = trapOnNull(this,(Expression *)
                          field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::Field>._16_8_,
                     (Expression **)
                     (field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Field>._16_8_ + 0x10));
  if ((!bVar1) &&
     (bVar1 = wasm::Type::isInteger
                        ((Type *)(*(long *)(field.super__Optional_base<wasm::Field,_true,_true>.
                                            _M_payload.super__Optional_payload_base<wasm::Field>.
                                            _16_8_ + 0x20) + 8)), bVar1)) {
    GCTypeUtils::getField
              ((optional<wasm::Field> *)local_30,
               (Type)*(uintptr_t *)
                      (*(long *)(field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
                                 super__Optional_payload_base<wasm::Field>._16_8_ + 0x10) + 8),0);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_30);
    if (bVar1) {
      value = (Expression **)
              (field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Field>._16_8_ + 0x20);
      this_00 = std::optional<wasm::Field>::operator->((optional<wasm::Field> *)local_30);
      bytes = Field::getByteSize(this_00);
      optimizeStoredValue(this,value,bytes);
    }
  }
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (curr->value->type.isInteger()) {
      if (auto field = GCTypeUtils::getField(curr->ref->type)) {
        optimizeStoredValue(curr->value, field->getByteSize());
      }
    }
  }